

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_modules
          (Impl *this,StateCreatorInterface *iface,Value *modules,uint8_t *varint,size_t varint_size
          )

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  LogLevel LVar4;
  VkShaderModuleCreateInfo *pVVar5;
  Pointer pVVar6;
  Ch *pCVar7;
  size_type sVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  VkShaderModuleCreateInfo *pVVar10;
  Type pGVar11;
  uint64_t uVar12;
  uint64_t buffer_size;
  uint32_t *puVar13;
  mapped_type *ppVVar14;
  uint64_t size;
  uint64_t offset;
  uint32_t *decoded;
  VkShaderModuleCreateInfo *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  Hash hash;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_50;
  ConstMemberIterator itr;
  uint index;
  VkShaderModuleCreateInfo *infos;
  size_t varint_size_local;
  uint8_t *varint_local;
  Value *modules_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(modules);
  pVVar5 = ScratchAllocator::allocate_n_cleared<VkShaderModuleCreateInfo>
                     (&this->allocator,(ulong)SVar2);
  itr.ptr_._4_4_ = 0;
  local_50.ptr_ =
       (Pointer)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberBegin(modules);
  do {
    hash = (Hash)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(modules);
    bVar1 = rapidjson::
            GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&local_50,
                         (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&hash);
    if (!bVar1) {
      (*iface->_vptr_StateCreatorInterface[0x11])();
      return true;
    }
    pVVar6 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->(&local_50);
    pCVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(&pVVar6->name);
    obj = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)string_to_uint64(pCVar7);
    sVar8 = std::
            unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
            ::count(&this->replayed_shader_modules,(key_type *)&obj);
    if (sVar8 == 0) {
      pVVar6 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_50);
      pGVar9 = &pVVar6->value;
      pVVar10 = pVVar5 + itr.ptr_._4_4_;
      pVVar10->sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)pGVar9,"flags");
      uVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar11);
      pVVar10->flags = uVar3;
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)pGVar9,"codeSize");
      uVar12 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetUint64(pGVar11);
      pVVar10->codeSize = uVar12;
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(pGVar9,"varintOffset");
      if ((bVar1) &&
         (bVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::HasMember(pGVar9,"varintSize"), bVar1)) {
        puVar13 = (uint32_t *)
                  ScratchAllocator::allocate_raw(&this->allocator,pVVar10->codeSize,0x40);
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)pGVar9,"varintOffset");
        uVar12 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetUint64(pGVar11);
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)pGVar9,"varintSize");
        buffer_size = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetUint64(pGVar11);
        if (varint_size < uVar12 + buffer_size) {
          LVar4 = get_thread_log_level();
          if (((int)LVar4 < 3) &&
             (bVar1 = Internal::log_thread_callback
                                (LOG_ERROR,"Binary varint buffer overflows payload.\n"), !bVar1)) {
            fprintf(_stderr,"Fossilize ERROR: Binary varint buffer overflows payload.\n");
          }
          return false;
        }
        bVar1 = decode_varint(puVar13,pVVar10->codeSize >> 2,varint + uVar12,buffer_size);
        if (!bVar1) {
          LVar4 = get_thread_log_level();
          if (((int)LVar4 < 3) &&
             (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Invalid varint format.\n"), !bVar1))
          {
            fprintf(_stderr,"Fossilize ERROR: Invalid varint format.\n");
          }
          return false;
        }
        pVVar10->pCode = puVar13;
      }
      else {
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)pGVar9,"code");
        pCVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar11);
        puVar13 = (uint32_t *)decode_base64(&this->allocator,pCVar7,pVVar10->codeSize);
        pVVar10->pCode = puVar13;
      }
      pGVar9 = obj;
      ppVVar14 = std::
                 unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                 ::operator[](&this->replayed_shader_modules,(key_type *)&obj);
      uVar3 = (*iface->_vptr_StateCreatorInterface[8])(iface,pGVar9,pVVar10,ppVVar14);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_50);
    itr.ptr_._4_4_ = itr.ptr_._4_4_ + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_shader_modules(StateCreatorInterface &iface, const Value &modules,
                                               const uint8_t *varint, size_t varint_size)
{
	auto *infos = allocator.allocate_n_cleared<VkShaderModuleCreateInfo>(modules.MemberCount());

	unsigned index = 0;
	for (auto itr = modules.MemberBegin(); itr != modules.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_shader_modules.count(hash))
			continue;

		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
		info.flags = obj["flags"].GetUint();
		info.codeSize = obj["codeSize"].GetUint64();

		if (obj.HasMember("varintOffset") && obj.HasMember("varintSize"))
		{
			uint32_t *decoded = static_cast<uint32_t *>(allocator.allocate_raw(info.codeSize, 64));
			auto offset = obj["varintOffset"].GetUint64();
			auto size = obj["varintSize"].GetUint64();
			if (offset + size > varint_size)
			{
				LOGE_LEVEL("Binary varint buffer overflows payload.\n");
				return false;
			}

			if (!decode_varint(decoded, info.codeSize / 4, varint + offset, size))
			{
				LOGE_LEVEL("Invalid varint format.\n");
				return false;
			}

			info.pCode = decoded;
		}
		else
			info.pCode = reinterpret_cast<uint32_t *>(decode_base64(allocator, obj["code"].GetString(), info.codeSize));

		if (!iface.enqueue_create_shader_module(hash, &info, &replayed_shader_modules[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}